

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O0

int compress2file_from_mem
              (char *inmemptr,size_t inmemsize,FILE *outdiskfile,size_t *filesize,int *status)

{
  int iVar1;
  size_t sVar2;
  undefined8 *in_RCX;
  FILE *in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  z_stream c_stream;
  uInt nBytesToFile;
  uLong iPage;
  uLong nPages;
  char *outfilebuff;
  int flushflag;
  int err;
  int local_d0;
  long local_c8;
  int local_c0;
  void *local_b0;
  int local_a8;
  undefined8 local_a0;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  uint local_54;
  ulong local_50;
  ulong local_48;
  void *local_40;
  undefined4 local_38;
  int local_34;
  int *local_30;
  undefined8 *local_28;
  FILE *local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_48 = 1;
  local_50 = 0;
  local_54 = 0;
  if (*in_R8 < 1) {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_40 = malloc(0x1c200);
    if (local_40 == (void *)0x0) {
      *local_30 = 0x71;
      local_4 = 0x71;
    }
    else {
      local_88 = 0;
      local_80 = 0;
      local_78 = 0;
      iVar1 = deflateInit2_(&local_c8,1,8,0x1f,8,0,"1.2.11",0x70);
      if (iVar1 == 0) {
        if (local_18 != 0) {
          local_48 = (local_18 - 1U) / 0xffffffff + 1;
        }
        local_34 = 0;
        for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
          local_c8 = local_10 + local_50 * 0xffffffff;
          if (local_50 == local_48 - 1) {
            local_d0 = (int)local_18 + (int)local_50;
          }
          else {
            local_d0 = -1;
          }
          local_c0 = local_d0;
          local_38 = 4;
          if (local_50 < local_48 - 1) {
            local_38 = 0;
          }
          do {
            local_b0 = local_40;
            local_a8 = 0x1c200;
            local_34 = deflate(&local_c8,local_38);
            if (local_34 == -2) {
              deflateEnd(&local_c8);
              free(local_40);
              *local_30 = 0x19d;
              return 0x19d;
            }
            local_54 = 0x1c200 - local_a8;
            if ((local_54 != 0) &&
               (sVar2 = fwrite(local_40,1,(ulong)local_54,local_20), sVar2 != local_54)) {
              deflateEnd(&local_c8);
              free(local_40);
              *local_30 = 0x19d;
              return 0x19d;
            }
          } while (local_a8 == 0);
        }
        free(local_40);
        if (local_28 != (undefined8 *)0x0) {
          *local_28 = local_a0;
        }
        iVar1 = deflateEnd(&local_c8);
        if (iVar1 == 0) {
          local_4 = *local_30;
        }
        else {
          *local_30 = 0x19d;
          local_4 = 0x19d;
        }
      }
      else {
        *local_30 = 0x19d;
        local_4 = 0x19d;
      }
    }
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int compress2file_from_mem(                                                
             char *inmemptr,     /* I - memory pointer to uncompressed bytes */
             size_t inmemsize,   /* I - size of input uncompressed file      */
             FILE *outdiskfile, 
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)

/*
  Compress the memory file into disk file. 
*/
{
    int err, flushflag;
    char  *outfilebuff;
    uLong nPages=1, iPage=0;
    uInt nBytesToFile=0;
    z_stream c_stream;  /* compression stream */

    if (*status > 0)
        return(*status);
    
    /* Allocate buffer to hold compressed bytes */
    outfilebuff = (char*)malloc(GZBUFSIZE);
    if (!outfilebuff) return(*status = 113); /* memory error */

    c_stream.zalloc = (alloc_func)0;
    c_stream.zfree = (free_func)0;
    c_stream.opaque = (voidpf)0;

    /* Initialize the compression.  The argument (15+16) tells the 
       compressor that we are to use the gzip algorythm.
       Also use Z_BEST_SPEED for maximum speed with very minor loss
       in compression factor. */
    err = deflateInit2(&c_stream, Z_BEST_SPEED, Z_DEFLATED,
                       (15+16), 8, Z_DEFAULT_STRATEGY);

    if (err != Z_OK) return(*status = 413);

    if (inmemsize > 0)
       nPages = 1 + (uLong)(inmemsize-1)/(uLong)UINT_MAX;

    for (iPage=0; iPage<nPages; ++iPage)
    {
       c_stream.next_in = (unsigned char*)inmemptr + iPage*UINT_MAX;
       c_stream.avail_in = (iPage == nPages-1) ? 
                  inmemsize - iPage*UINT_MAX : UINT_MAX;
       
       flushflag = (iPage < nPages-1) ? Z_NO_FLUSH : Z_FINISH; 
       do {
           c_stream.next_out = (unsigned char*) outfilebuff;
           c_stream.avail_out = GZBUFSIZE;
           
           /* compress as much of the input as will fit in the output */
           err = deflate(&c_stream, flushflag);

           if (err == Z_STREAM_ERROR)
           {
               deflateEnd(&c_stream);
               free(outfilebuff);
               return(*status = 413);
           }
           else
           {
              /* c_stream.avail_out will be 0 unless we've reached the end of the avail_in 
                 stream.  When that happens avail_out MAY also be 0, if by chance the output
                 buffer fills up just as the input stream ends.  That's OK though, as it will
                 execute just one more do/while where the deflate call won't actually do
                 anything.  */
              nBytesToFile = GZBUFSIZE - c_stream.avail_out;
              if (nBytesToFile)
              {
                 if (fwrite(outfilebuff, 1, nBytesToFile, outdiskfile) != nBytesToFile)
                 {
                    deflateEnd(&c_stream);
                    free(outfilebuff);
                    return(*status = 413);                 
                 }
              }
           }
        } while (c_stream.avail_out == 0);

    }

    free(outfilebuff); /* free temporary output data buffer */

    /* Set the output file size to be the total output data */
    if (filesize) *filesize = c_stream.total_out;

    /* End the compression */
    err = deflateEnd(&c_stream);

    if (err != Z_OK) return(*status = 413);
     
    return(*status);
}